

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_parameterization_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::PointCloudParameterizationQuantity::createProgram
          (PointCloudParameterizationQuantity *this)

{
  long *plVar1;
  ParamVizStyle PVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  element_type *peVar4;
  long in_RDI;
  shared_ptr<polyscope::render::ShaderProgram> *in_stack_fffffffffffff928;
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffff930;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff940;
  allocator_type *in_stack_fffffffffffff958;
  allocator *paVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff960;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff968;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff980;
  PointCloud *in_stack_fffffffffffff988;
  string *local_650;
  ShaderProgram *in_stack_fffffffffffff9c8;
  PointCloud *in_stack_fffffffffffff9d0;
  string *in_stack_fffffffffffffa20;
  ShaderProgram *in_stack_fffffffffffffa28;
  Engine *in_stack_fffffffffffffa30;
  string *local_598;
  string *local_508;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_488;
  undefined1 local_430 [40];
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [36];
  undefined1 local_3bc [2];
  allocator local_3ba;
  allocator local_3b9;
  PointCloud *local_3b8;
  string local_3b0 [32];
  string local_390 [32];
  undefined1 local_370 [64];
  string local_330 [8];
  size_type local_328;
  undefined1 local_308 [31];
  allocator local_2e9;
  string local_2e8 [32];
  undefined1 local_2c8 [23];
  allocator local_2b1;
  string local_2b0 [36];
  undefined1 local_28c;
  allocator local_28b;
  allocator local_28a;
  allocator local_289;
  element_type *local_288;
  undefined1 local_280 [64];
  undefined1 local_240 [40];
  size_t local_218;
  undefined1 local_1f8 [31];
  allocator local_1d9;
  string local_1d8 [32];
  undefined1 local_1b8 [22];
  allocator local_1a2;
  allocator local_1a1 [9];
  element_type local_198;
  element_type *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  undefined1 local_130 [31];
  allocator local_111;
  string local_110 [32];
  undefined1 local_f0 [21];
  undefined1 local_db;
  allocator local_da;
  allocator local_d9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_d0 [2];
  string local_b0 [32];
  undefined1 local_90 [40];
  undefined1 local_68 [47];
  allocator local_39;
  string local_38 [32];
  undefined1 local_18 [24];
  
  PVar2 = getStyle((PointCloudParameterizationQuantity *)0x39d904);
  plVar1 = render::engine;
  switch(PVar2) {
  case CHECKER:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"RAYCAST_SPHERE",&local_39);
    local_db = 1;
    local_d8 = local_d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_d0,"SPHERE_PROPAGATE_VALUE2",&local_d9);
    local_d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"SHADE_CHECKER_VALUE2",&local_da);
    local_db = 0;
    local_90._0_8_ = local_d0;
    local_90._8_8_ = (element_type *)0x2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x39da5f);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffff960,in_stack_fffffffffffff968,in_stack_fffffffffffff958);
    PointCloud::addStructureRules(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
    (**(code **)(*plVar1 + 0x118))(local_18,plVar1,local_38,local_68,0);
    std::shared_ptr<polyscope::render::ShaderProgram>::operator=
              ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff930,
               in_stack_fffffffffffff928);
    std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
              ((shared_ptr<polyscope::render::ShaderProgram> *)0x39daff);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffff940);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffff940);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x39db26);
    local_488 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90;
    do {
      local_488 = local_488 + -2;
      std::__cxx11::string::~string((string *)local_488);
    } while (local_488 != local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_da);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    break;
  case GRID:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"RAYCAST_SPHERE",&local_111);
    local_1b8[0x15] = '\x01';
    local_1a1._1_8_ = &local_198;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,"SPHERE_PROPAGATE_VALUE2",local_1a1);
    local_1a1._1_8_ = &local_198.usePrimitiveRestart;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_198.usePrimitiveRestart,"SHADE_GRID_VALUE2",&local_1a2);
    local_1b8[0x15] = '\0';
    local_158 = &local_198;
    local_150._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x39de81);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffff960,in_stack_fffffffffffff968,in_stack_fffffffffffff958);
    PointCloud::addStructureRules(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
    (**(code **)(*plVar1 + 0x118))(local_f0,plVar1,local_110,local_130,0);
    std::shared_ptr<polyscope::render::ShaderProgram>::operator=
              ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff930,
               in_stack_fffffffffffff928);
    std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
              ((shared_ptr<polyscope::render::ShaderProgram> *)0x39df21);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffff940);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffff940);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x39df48);
    local_508 = (string *)&local_158;
    do {
      local_508 = local_508 + -0x20;
      std::__cxx11::string::~string(local_508);
    } while ((element_type *)local_508 != &local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a2);
    std::allocator<char>::~allocator((allocator<char> *)local_1a1);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    break;
  case LOCAL_CHECK:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"RAYCAST_SPHERE",&local_1d9);
    local_28c = 1;
    local_288 = (element_type *)local_280;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_280,"SPHERE_PROPAGATE_VALUE2",&local_289);
    local_288 = (element_type *)(local_280 + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_280 + 0x20),"SHADE_COLORMAP_ANGULAR2",&local_28a);
    local_288 = (element_type *)local_240;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_240,"CHECKER_VALUE2COLOR",&local_28b);
    local_28c = 0;
    local_240._32_8_ = local_280;
    local_218 = 3;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x39e2ee);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffff960,in_stack_fffffffffffff968,in_stack_fffffffffffff958);
    PointCloud::addStructureRules(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
    (**(code **)(*plVar1 + 0x118))(local_1b8,plVar1,local_1d8,local_1f8,0);
    std::shared_ptr<polyscope::render::ShaderProgram>::operator=
              ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff930,
               in_stack_fffffffffffff928);
    std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
              ((shared_ptr<polyscope::render::ShaderProgram> *)0x39e38e);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffff940);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffff940);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x39e3b5);
    local_598 = (string *)(local_240 + 0x20);
    do {
      local_598 = local_598 + -0x20;
      std::__cxx11::string::~string(local_598);
    } while (local_598 != (string *)local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_28b);
    std::allocator<char>::~allocator((allocator<char> *)&local_28a);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    peVar4 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x39e45c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b0,"t_colormap",&local_2b1);
    pbVar3 = PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get((PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(in_RDI + 0x1b8));
    (*peVar4->_vptr_ShaderProgram[0x19])(peVar4,local_2b0,pbVar3,0);
    std::__cxx11::string::~string(local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    break;
  case LOCAL_RAD:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e8,"RAYCAST_SPHERE",&local_2e9);
    local_3e0[0x23] = (string)0x1;
    local_3b8 = (PointCloud *)local_3b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b0,"SPHERE_PROPAGATE_VALUE2",&local_3b9);
    local_3b8 = (PointCloud *)local_390;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_390,"SHADE_COLORMAP_ANGULAR2",&local_3ba);
    in_stack_fffffffffffff9d0 = (PointCloud *)local_370;
    local_3b8 = in_stack_fffffffffffff9d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)in_stack_fffffffffffff9d0,"SHADEVALUE_MAG_VALUE2",
               (allocator *)(local_3bc + 1));
    in_stack_fffffffffffff9c8 = (ShaderProgram *)local_3bc;
    local_3b8 = (PointCloud *)(local_370 + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_370 + 0x20),"ISOLINE_STRIPE_VALUECOLOR",
               (allocator *)in_stack_fffffffffffff9c8);
    local_3e0[0x23] = (string)0x0;
    local_330 = (string  [8])local_3b0;
    local_328 = 4;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x39e8d1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffff960,in_stack_fffffffffffff968,in_stack_fffffffffffff958);
    PointCloud::addStructureRules(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
    (**(code **)(*plVar1 + 0x118))(local_2c8,plVar1,local_2e8,local_308,0);
    std::shared_ptr<polyscope::render::ShaderProgram>::operator=
              ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff930,
               in_stack_fffffffffffff928);
    std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
              ((shared_ptr<polyscope::render::ShaderProgram> *)0x39e971);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffff940);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffff940);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x39e998);
    local_650 = local_330;
    do {
      local_650 = local_650 + -0x20;
      std::__cxx11::string::~string(local_650);
    } while (local_650 != local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)local_3bc);
    std::allocator<char>::~allocator((allocator<char> *)(local_3bc + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_3ba);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    peVar4 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x39ea48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e0,"t_colormap",&local_3e1);
    pbVar3 = PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get((PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(in_RDI + 0x1b8));
    (*peVar4->_vptr_ShaderProgram[0x19])(peVar4,local_3e0,pbVar3,0);
    std::__cxx11::string::~string(local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  }
  std::
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffff930);
  PointCloud::fillGeometryBuffers(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  peVar4 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x39ed22);
  paVar5 = (allocator *)(local_430 + 0x27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"a_value2",paVar5);
  (*peVar4->_vptr_ShaderProgram[0xf])(peVar4,local_408,in_RDI + 0x60,0,0,0xffffffff);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)(local_430 + 0x27));
  std::
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffff930);
  PointCloud::getMaterial_abi_cxx11_((PointCloud *)local_430);
  render::Engine::setMaterial
            (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  std::__cxx11::string::~string((string *)local_430);
  return;
}

Assistant:

void PointCloudParameterizationQuantity::createProgram() {
  // Create the program to draw this quantity

  switch (getStyle()) {
  case ParamVizStyle::CHECKER:
    // program = render::engine->generateShaderProgram(
    //{render::PARAM_SURFACE_VERT_SHADER, render::PARAM_CHECKER_SURFACE_FRAG_SHADER}, DrawMode::Triangles);
    program = render::engine->requestShader(
        "RAYCAST_SPHERE", parent.addStructureRules({"SPHERE_PROPAGATE_VALUE2", "SHADE_CHECKER_VALUE2"}));
    break;
  case ParamVizStyle::GRID:
    // program = render::engine->generateShaderProgram(
    //{render::PARAM_SURFACE_VERT_SHADER, render::PARAM_GRID_SURFACE_FRAG_SHADER}, DrawMode::Triangles);
    program = render::engine->requestShader("RAYCAST_SPHERE",
                                            parent.addStructureRules({"SPHERE_PROPAGATE_VALUE2", "SHADE_GRID_VALUE2"}));
    break;
  case ParamVizStyle::LOCAL_CHECK:
    // program = render::engine->generateShaderProgram(
    //{render::PARAM_SURFACE_VERT_SHADER, render::PARAM_LOCAL_CHECKER_SURFACE_FRAG_SHADER}, DrawMode::Triangles);
    program = render::engine->requestShader(
        "RAYCAST_SPHERE",
        parent.addStructureRules({"SPHERE_PROPAGATE_VALUE2", "SHADE_COLORMAP_ANGULAR2", "CHECKER_VALUE2COLOR"}));
    program->setTextureFromColormap("t_colormap", cMap.get());
    break;
  case ParamVizStyle::LOCAL_RAD:
    // program = render::engine->generateShaderProgram(
    //{render::PARAM_SURFACE_VERT_SHADER, render::PARAM_LOCAL_RAD_SURFACE_FRAG_SHADER}, DrawMode::Triangles);
    program = render::engine->requestShader(
        "RAYCAST_SPHERE", parent.addStructureRules({"SPHERE_PROPAGATE_VALUE2", "SHADE_COLORMAP_ANGULAR2",
                                                    "SHADEVALUE_MAG_VALUE2", "ISOLINE_STRIPE_VALUECOLOR"}));
    program->setTextureFromColormap("t_colormap", cMap.get());
    break;
  }

  // Fill buffers
  parent.fillGeometryBuffers(*program);
  program->setAttribute("a_value2", coords);

  render::engine->setMaterial(*program, parent.getMaterial());
}